

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionStateTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionStateTests::TestBackupSessionLog_StateLogNotNull_LogBackedUp::
TestBackupSessionLog_StateLogNotNull_LogBackedUp
          (TestBackupSessionLog_StateLogNotNull_LogBackedUp *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"BackupSessionLog_StateLogNotNull_LogBackedUp","SessionStateTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionStateTestCase.cpp"
             ,0x52);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031f090;
  return;
}

Assistant:

TEST(BackupSessionLog_StateLogNotNull_LogBackedUp)
  {
    SessionSettings settings;
    TestLog log;
    log.events = 5;

    SessionState state;
    state.log(&log);

    state.backup();

    CHECK_EQUAL(5, log.eventsBackup);
  }